

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int saveCursorsOnList(BtCursor *p,Pgno iRoot,BtCursor *pExcept)

{
  int iVar1;
  int rc;
  BtCursor *pExcept_local;
  BtCursor *pBStack_18;
  Pgno iRoot_local;
  BtCursor *p_local;
  
  pBStack_18 = p;
  do {
    if ((pBStack_18 != pExcept) && ((iRoot == 0 || (pBStack_18->pgnoRoot == iRoot)))) {
      if ((pBStack_18->eState == '\x01') || (pBStack_18->eState == '\x02')) {
        iVar1 = saveCursorPosition(pBStack_18);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        btreeReleaseAllCursorPages(pBStack_18);
      }
    }
    pBStack_18 = pBStack_18->pNext;
  } while (pBStack_18 != (BtCursor *)0x0);
  return 0;
}

Assistant:

static int SQLITE_NOINLINE saveCursorsOnList(
  BtCursor *p,         /* The first cursor that needs saving */
  Pgno iRoot,          /* Only save cursor with this iRoot. Save all if zero */
  BtCursor *pExcept    /* Do not save this cursor */
){
  do{
    if( p!=pExcept && (0==iRoot || p->pgnoRoot==iRoot) ){
      if( p->eState==CURSOR_VALID || p->eState==CURSOR_SKIPNEXT ){
        int rc = saveCursorPosition(p);
        if( SQLITE_OK!=rc ){
          return rc;
        }
      }else{
        testcase( p->iPage>0 );
        btreeReleaseAllCursorPages(p);
      }
    }
    p = p->pNext;
  }while( p );
  return SQLITE_OK;
}